

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_8c6fd8::ProbModelXMLScopeFunctor::operator()(ProbModelXMLScopeFunctor *this)

{
  FactoredDecPOMDPDiscrete *in_stack_00000438;
  ParserProbModelXML *in_stack_00000440;
  
  SetScopes(in_stack_00000440,in_stack_00000438);
  return;
}

Assistant:

void operator()(){SetScopes(_m_parser,_m_fDecPOMDP);}